

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_estimateSubBlockSize_symbolType
                 (symbolEncodingType_e type,BYTE *codeTable,uint maxCode,size_t nbSeq,
                 FSE_CTable *fseCTable,U8 *additionalBits,short *defaultNorm,U32 defaultNormLog,
                 U32 defaultMax,void *workspace,size_t wkspSize)

{
  byte bVar1;
  uint uVar2;
  uint *count;
  FSE_CTable *in_RCX;
  uint in_EDX;
  uint *in_RSI;
  int in_EDI;
  uint *in_R8;
  long in_R9;
  short *in_stack_00000008;
  uint in_stack_00000010;
  uint max;
  size_t cSymbolTypeSizeEstimateInBits;
  BYTE *ctEnd;
  BYTE *ctStart;
  BYTE *ctp;
  uint *countWksp;
  void *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  size_t code;
  undefined8 local_48;
  undefined8 local_8;
  
  count = (uint *)((long)in_RSI + (long)in_RCX);
  code = 0;
  HIST_countFast_wksp(count,(uint *)0x0,(void *)CONCAT44(in_EDX,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0xa3aaf0);
  if (in_EDI == 0) {
    if ((uint)cSymbolTypeSizeEstimateInBits < in_EDX) {
      code = 0xffffffffffffffff;
    }
    else {
      code = ZSTD_crossEntropyCost(in_stack_00000008,in_stack_00000010,(uint *)ctEnd,in_EDX);
    }
  }
  else if (in_EDI == 1) {
    code = 0;
  }
  else if ((in_EDI == 2) || (in_EDI == 3)) {
    code = ZSTD_fseBitCost(in_RCX,in_R8,(uint)((ulong)in_R9 >> 0x20));
  }
  uVar2 = ERR_isError(code);
  local_48 = in_RSI;
  if (uVar2 == 0) {
    for (; local_48 < count; local_48 = (uint *)((long)local_48 + 1)) {
      if (in_R9 == 0) {
        bVar1 = (byte)*local_48;
      }
      else {
        bVar1 = *(byte *)(in_R9 + (ulong)(byte)*local_48);
      }
      code = bVar1 + code;
    }
    local_8 = code >> 3;
  }
  else {
    local_8 = (long)in_RCX * 10;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_estimateSubBlockSize_symbolType(symbolEncodingType_e type,
                        const BYTE* codeTable, unsigned maxCode,
                        size_t nbSeq, const FSE_CTable* fseCTable,
                        const U8* additionalBits,
                        short const* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                        void* workspace, size_t wkspSize)
{
    unsigned* const countWksp = (unsigned*)workspace;
    const BYTE* ctp = codeTable;
    const BYTE* const ctStart = ctp;
    const BYTE* const ctEnd = ctStart + nbSeq;
    size_t cSymbolTypeSizeEstimateInBits = 0;
    unsigned max = maxCode;

    HIST_countFast_wksp(countWksp, &max, codeTable, nbSeq, workspace, wkspSize);  /* can't fail */
    if (type == set_basic) {
        /* We selected this encoding type, so it must be valid. */
        assert(max <= defaultMax);
        cSymbolTypeSizeEstimateInBits = max <= defaultMax
                ? ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, countWksp, max)
                : ERROR(GENERIC);
    } else if (type == set_rle) {
        cSymbolTypeSizeEstimateInBits = 0;
    } else if (type == set_compressed || type == set_repeat) {
        cSymbolTypeSizeEstimateInBits = ZSTD_fseBitCost(fseCTable, countWksp, max);
    }
    if (ZSTD_isError(cSymbolTypeSizeEstimateInBits)) return nbSeq * 10;
    while (ctp < ctEnd) {
        if (additionalBits) cSymbolTypeSizeEstimateInBits += additionalBits[*ctp];
        else cSymbolTypeSizeEstimateInBits += *ctp; /* for offset, offset code is also the number of additional bits */
        ctp++;
    }
    return cSymbolTypeSizeEstimateInBits / 8;
}